

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestAbort::Run(TestAbort *this)

{
  pointer *this_00;
  int iVar1;
  pointer outputter;
  long lVar2;
  bool local_1771;
  string local_1740 [39];
  allocator local_1719;
  undefined1 local_1718 [8];
  Results rs;
  RunParams params;
  string local_16e0 [32];
  undefined1 local_16c0 [8];
  TestAbortInternal myTestB;
  string local_1670 [32];
  undefined1 local_1650 [8];
  TestAbortInternal myTestA;
  unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
  local_1600;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> local_15f8;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> op;
  ostringstream local_15e0 [8];
  ostringstream oss;
  undefined1 local_1468 [8];
  TestRegistry r;
  TestAbort *this_local;
  
  r._5192_8_ = this;
  testinator::TestRegistry::TestRegistry((TestRegistry *)local_1468);
  std::__cxx11::ostringstream::ostringstream(local_15e0);
  myTestA._68_4_ = 0;
  std::
  make_unique<testinator::DefaultOutputter,std::__cxx11::ostringstream&,testinator::OutputFlags>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1600
             ,(OutputFlags *)local_15e0);
  std::unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>>::
  unique_ptr<testinator::DefaultOutputter,std::default_delete<testinator::DefaultOutputter>,void>
            ((unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>> *)
             &local_15f8,&local_1600);
  std::unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
  ::~unique_ptr(&local_1600);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1670,"A",(allocator *)&myTestB.field_0x47);
  TestAbortInternal::TestAbortInternal
            ((TestAbortInternal *)local_1650,(TestRegistry *)local_1468,(string *)local_1670);
  std::__cxx11::string::~string(local_1670);
  std::allocator<char>::~allocator((allocator<char> *)&myTestB.field_0x47);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16e0,"B",(allocator *)((long)&params.m_randomSeed + 7));
  TestAbortInternal::TestAbortInternal
            ((TestAbortInternal *)local_16c0,(TestRegistry *)local_1468,(string *)local_16e0);
  std::__cxx11::string::~string(local_16e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&params.m_randomSeed + 7));
  this_00 = &rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  testinator::RunParams::RunParams((RunParams *)this_00);
  rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  outputter = std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::
              get(&local_15f8);
  testinator::TestRegistry::RunAllTests
            ((Results *)local_1718,(TestRegistry *)local_1468,(RunParams *)this_00,outputter);
  if ((Run()::expected_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Run()::expected_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)Run()::expected_abi_cxx11_,"ABORT (Hello world 42)",&local_1719);
    std::allocator<char>::~allocator((allocator<char> *)&local_1719);
    __cxa_atexit(std::__cxx11::string::~string,Run()::expected_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&Run()::expected_abi_cxx11_);
  }
  local_1771 = false;
  if (((byte)myTestB.super_Test.m_op & 1) == 0) {
    std::__cxx11::ostringstream::str();
    lVar2 = std::__cxx11::string::find(local_1740,0x2c6b48);
    local_1771 = lVar2 != -1;
    std::__cxx11::string::~string(local_1740);
  }
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_1718);
  TestAbortInternal::~TestAbortInternal((TestAbortInternal *)local_16c0);
  TestAbortInternal::~TestAbortInternal((TestAbortInternal *)local_1650);
  std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::~unique_ptr
            (&local_15f8);
  std::__cxx11::ostringstream::~ostringstream(local_15e0);
  testinator::TestRegistry::~TestRegistry((TestRegistry *)local_1468);
  return local_1771;
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::DefaultOutputter>(oss, testinator::OF_NONE);

    TestAbortInternal myTestA(r, "A");
    TestAbortInternal myTestB(r, "B");
    testinator::RunParams params;
    params.m_flags = testinator::RF_ALPHA_ORDER;
    testinator::Results rs = r.RunAllTests(params, op.get());

    static string expected = "ABORT (Hello world 42)";
    return !myTestB.m_runCalled
      && oss.str().find(expected) != string::npos;
  }